

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v5_19.c
# Opt level: O3

int can_calc_bittiming_v5_19(net_device *dev,can_bittiming *bt,can_bittiming_const *btc)

{
  uint tseg;
  uint uVar1;
  __u32 _Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint tseg2;
  uint tseg1;
  uint sample_point_error;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  can_bittiming *local_60;
  uint local_58;
  __u32 local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  net_device *local_40;
  can_bittiming_const *local_38;
  
  local_64 = 0;
  local_70 = 0;
  local_68 = 0;
  local_6c = bt->sample_point;
  if (bt->sample_point == 0) {
    local_6c = 0x2ee;
    if (bt->bitrate < 0xc3501) {
      local_6c = 0x36b;
      if (500000 < bt->bitrate) {
        local_6c = 800;
      }
    }
  }
  uVar9 = (btc->tseg2_max + btc->tseg1_max) * 2 + 1;
  uVar4 = (btc->tseg2_min + btc->tseg1_min) * 2;
  local_78 = 0xffffffff;
  local_74 = 0;
  local_60 = bt;
  local_40 = dev;
  if (uVar9 < uVar4) {
LAB_00102710:
    if (0x32 < (uint)(((ulong)local_78 * 1000) / (ulong)local_60->bitrate)) {
      return -0x21;
    }
  }
  else {
    _Var2 = (dev->priv).clock.freq;
    uVar6 = bt->bitrate;
    local_48 = btc->brp_min;
    local_4c = btc->brp_inc;
    local_70 = 0;
    local_78 = 0xffffffff;
    uVar5 = 0xffffffff;
    local_74 = 0;
    local_58 = uVar6;
    local_54 = _Var2;
    local_50 = uVar4;
    local_38 = btc;
    do {
      tseg = uVar9 >> 1;
      uVar7 = (uVar9 & 1) + _Var2 / (uVar6 * (tseg + 1));
      uVar7 = uVar7 - uVar7 % local_4c;
      if ((local_48 <= uVar7) && (uVar7 <= btc->brp_max)) {
        uVar3 = _Var2 / ((tseg + 1) * uVar7);
        uVar1 = uVar6 - uVar3;
        uVar8 = -uVar1;
        if (0 < (int)uVar1) {
          uVar8 = uVar1;
        }
        if (uVar8 <= local_78) {
          if (uVar8 < local_78) {
            uVar5 = 0xffffffff;
          }
          can_update_sample_point_v5_19(btc,local_6c,tseg,&local_64,&local_68,&local_44);
          btc = local_38;
          uVar4 = local_50;
          _Var2 = local_54;
          uVar6 = local_58;
          if ((local_44 < uVar5) &&
             (local_74 = uVar7, uVar5 = local_44, local_70 = tseg, local_78 = uVar8,
             uVar3 == local_58 && local_44 == 0)) goto LAB_00102740;
        }
      }
      uVar9 = uVar9 - 1;
    } while (uVar4 <= uVar9);
    if (local_78 != 0) goto LAB_00102710;
  }
LAB_00102740:
  _Var2 = can_update_sample_point_v5_19(btc,local_6c,local_70,&local_64,&local_68,(uint *)0x0);
  local_60->sample_point = _Var2;
  local_60->tq = (__u32)(((ulong)local_74 * 1000000000) / (ulong)(local_40->priv).clock.freq);
  local_60->prop_seg = local_64 >> 1;
  local_60->phase_seg1 = local_64 - (local_64 >> 1);
  local_60->phase_seg2 = local_68;
  uVar9 = local_60->sjw;
  uVar4 = 1;
  if ((uVar9 != 0) && (uVar6 = btc->sjw_max, uVar6 != 0)) {
    uVar5 = uVar6;
    if (uVar9 < uVar6) {
      uVar5 = uVar9;
    }
    uVar4 = uVar5;
    if (local_68 < uVar5) {
      uVar4 = local_68;
    }
    if (uVar9 <= uVar6 && local_68 >= uVar5) goto LAB_001027d5;
  }
  local_60->sjw = uVar4;
LAB_001027d5:
  local_60->brp = local_74;
  local_60->bitrate = (local_40->priv).clock.freq / ((local_64 + local_68 + 1) * local_74);
  return 0;
}

Assistant:

int can_calc_bittiming(const struct net_device *dev, struct can_bittiming *bt,
		       const struct can_bittiming_const *btc)
{
	struct can_priv *priv = netdev_priv(dev);
	unsigned int bitrate;			/* current bitrate */
	unsigned int bitrate_error;		/* difference between current and nominal value */
	unsigned int best_bitrate_error = UINT_MAX;
	unsigned int sample_point_error;	/* difference between current and nominal value */
	unsigned int best_sample_point_error = UINT_MAX;
	unsigned int sample_point_nominal;	/* nominal sample point */
	unsigned int best_tseg = 0;		/* current best value for tseg */
	unsigned int best_brp = 0;		/* current best value for brp */
	unsigned int brp, tsegall, tseg, tseg1 = 0, tseg2 = 0;
	u64 v64;

	/* Use CiA recommended sample points */
	if (bt->sample_point) {
		sample_point_nominal = bt->sample_point;
	} else {
		if (bt->bitrate > 800 * KILO /* BPS */)
			sample_point_nominal = 750;
		else if (bt->bitrate > 500 * KILO /* BPS */)
			sample_point_nominal = 800;
		else
			sample_point_nominal = 875;
	}

	/* tseg even = round down, odd = round up */
	for (tseg = (btc->tseg1_max + btc->tseg2_max) * 2 + 1;
	     tseg >= (btc->tseg1_min + btc->tseg2_min) * 2; tseg--) {
		tsegall = CAN_SYNC_SEG + tseg / 2;

		/* Compute all possible tseg choices (tseg=tseg1+tseg2) */
		brp = priv->clock.freq / (tsegall * bt->bitrate) + tseg % 2;

		/* choose brp step which is possible in system */
		brp = (brp / btc->brp_inc) * btc->brp_inc;
		if (brp < btc->brp_min || brp > btc->brp_max)
			continue;

		bitrate = priv->clock.freq / (brp * tsegall);
		bitrate_error = abs(bt->bitrate - bitrate);

		/* tseg brp biterror */
		if (bitrate_error > best_bitrate_error)
			continue;

		/* reset sample point error if we have a better bitrate */
		if (bitrate_error < best_bitrate_error)
			best_sample_point_error = UINT_MAX;

		can_update_sample_point(btc, sample_point_nominal, tseg / 2,
					&tseg1, &tseg2, &sample_point_error);
		if (sample_point_error >= best_sample_point_error)
			continue;

		best_sample_point_error = sample_point_error;
		best_bitrate_error = bitrate_error;
		best_tseg = tseg / 2;
		best_brp = brp;

		if (bitrate_error == 0 && sample_point_error == 0)
			break;
	}

	if (best_bitrate_error) {
		/* Error in one-tenth of a percent */
		v64 = (u64)best_bitrate_error * 1000;
		do_div(v64, bt->bitrate);
		bitrate_error = (u32)v64;
		if (bitrate_error > CAN_CALC_MAX_ERROR) {
			netdev_err(dev,
				   "bitrate error %d.%d%% too high\n",
				   bitrate_error / 10, bitrate_error % 10);
			return -EDOM;
		}
		netdev_warn(dev, "bitrate error %d.%d%%\n",
			    bitrate_error / 10, bitrate_error % 10);
	}

	/* real sample point */
	bt->sample_point = can_update_sample_point(btc, sample_point_nominal,
						   best_tseg, &tseg1, &tseg2,
						   NULL);

	v64 = (u64)best_brp * 1000 * 1000 * 1000;
	do_div(v64, priv->clock.freq);
	bt->tq = (u32)v64;
	bt->prop_seg = tseg1 / 2;
	bt->phase_seg1 = tseg1 - bt->prop_seg;
	bt->phase_seg2 = tseg2;

	/* check for sjw user settings */
	if (!bt->sjw || !btc->sjw_max) {
		bt->sjw = 1;
	} else {
		/* bt->sjw is at least 1 -> sanitize upper bound to sjw_max */
		if (bt->sjw > btc->sjw_max)
			bt->sjw = btc->sjw_max;
		/* bt->sjw must not be higher than tseg2 */
		if (tseg2 < bt->sjw)
			bt->sjw = tseg2;
	}

	bt->brp = best_brp;

	/* real bitrate */
	bt->bitrate = priv->clock.freq /
		(bt->brp * (CAN_SYNC_SEG + tseg1 + tseg2));

	return 0;
}